

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O2

LibraryHandle cmDynamicLoader::OpenLibrary(char *libname)

{
  bool bVar1;
  LibraryHandle pvVar2;
  iterator __position;
  mapped_type *ppvVar3;
  LibraryHandle *in_RDX;
  LibraryHandle *p;
  LibraryHandle h;
  allocator<char> local_49;
  string local_48;
  LibraryHandle local_28;
  allocator<char> local_20 [8];
  
  bVar1 = anon_unknown.dwarf_68be81::cmDynamicLoaderCache::GetCacheFile
                    ((cmDynamicLoaderCache *)libname,(char *)&local_28,in_RDX);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,libname,local_20);
    pvVar2 = cmsys::DynamicLoader::OpenLibrary(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    bVar1 = anon_unknown.dwarf_68be81::cmDynamicLoaderCache::GetCacheFile
                      ((cmDynamicLoaderCache *)libname,(char *)local_20,p);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,libname,&local_49);
      __position = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                           *)(anonymous_namespace)::cmDynamicLoaderCache::Instance,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      if (__position._M_node !=
          (_Base_ptr)((anonymous_namespace)::cmDynamicLoaderCache::Instance + 8)) {
        cmsys::DynamicLoader::CloseLibrary(*(LibraryHandle *)(__position._M_node + 2));
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void*>,std::_Select1st<std::pair<std::__cxx11::string_const,void*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void*>>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void*>,std::_Select1st<std::pair<std::__cxx11::string_const,void*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void*>>>
                            *)(anonymous_namespace)::cmDynamicLoaderCache::Instance,__position);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,libname,&local_49);
    ppvVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                            *)(anonymous_namespace)::cmDynamicLoaderCache::Instance,&local_48);
    *ppvVar3 = pvVar2;
    std::__cxx11::string::~string((string *)&local_48);
    local_28 = pvVar2;
  }
  return local_28;
}

Assistant:

cmsys::DynamicLoader::LibraryHandle cmDynamicLoader::OpenLibrary(
  const char* libname)
{
  cmsys::DynamicLoader::LibraryHandle lh;
  if (cmDynamicLoaderCache::GetInstance().GetCacheFile(libname, lh)) {
    return lh;
  }
  lh = cmsys::DynamicLoader::OpenLibrary(libname);
  cmDynamicLoaderCache::GetInstance().CacheFile(libname, lh);
  return lh;
}